

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_TextureMapping::Internal_WriteV5(ON_TextureMapping *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *pOVar1;
  bool bVar2;
  ON_UUID *uuid;
  element_type *o;
  undefined1 local_28 [23];
  bool rc;
  ON_BinaryArchive *file_local;
  ON_TextureMapping *this_local;
  
  unique0x10000171 = file;
  file_local = (ON_BinaryArchive *)this;
  local_28[0xf] = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
  pOVar1 = stack0xffffffffffffffe8;
  if ((bool)local_28[0xf]) {
    uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
    local_28[0xf] = ON_BinaryArchive::WriteUuid(pOVar1,uuid);
    if (((((bool)local_28[0xf]) &&
         (local_28[0xf] = ON_BinaryArchive::WriteInt(stack0xffffffffffffffe8,this->m_type),
         (bool)local_28[0xf])) &&
        (local_28[0xf] = ON_BinaryArchive::WriteInt(stack0xffffffffffffffe8,this->m_projection),
        (bool)local_28[0xf])) &&
       ((local_28[0xf] = ON_BinaryArchive::WriteXform(stack0xffffffffffffffe8,&this->m_Pxyz),
        (bool)local_28[0xf] &&
        (local_28[0xf] = ON_BinaryArchive::WriteXform(stack0xffffffffffffffe8,&this->m_uvw),
        pOVar1 = stack0xffffffffffffffe8, (bool)local_28[0xf])))) {
      ON_ModelComponent::Name((ON_ModelComponent *)local_28);
      local_28[0xf] = ON_BinaryArchive::WriteString(pOVar1,(ON_wString *)local_28);
      ON_wString::~ON_wString((ON_wString *)local_28);
      pOVar1 = stack0xffffffffffffffe8;
      if ((local_28[0xf] & 1) != 0) {
        o = std::__shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->m_mapping_primitive).
                        super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>);
        local_28[0xf] = ON_BinaryArchive::WriteObject(pOVar1,o);
        if (((bool)local_28[0xf]) &&
           (local_28[0xf] =
                 ON_BinaryArchive::WriteInt(stack0xffffffffffffffe8,this->m_texture_space),
           (bool)local_28[0xf])) {
          local_28[0xf] =
               ON_BinaryArchive::WriteBool(stack0xffffffffffffffe8,(bool)(this->m_bCapped & 1));
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(stack0xffffffffffffffe8);
    if (!bVar2) {
      local_28[0xf] = 0;
    }
  }
  return (bool)(local_28[0xf] & 1);
}

Assistant:

bool ON_TextureMapping::Internal_WriteV5(
  ON_BinaryArchive& file
  ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1);
  if (rc)
  {

    for(;;)
    {
      rc = file.WriteUuid( Id() );
      if (!rc) break;

      rc = file.WriteInt( static_cast<unsigned int>(m_type) );
      if (!rc) break;

      rc = file.WriteInt( static_cast<unsigned int>(m_projection) );
      if (!rc) break;

      rc = file.WriteXform( m_Pxyz );
      if (!rc) break;

      // Do not write m_Nxyz - it is calculated from m_Pxyz.
      rc = file.WriteXform( m_uvw );
      if (!rc) break;

      rc = file.WriteString(Name());
      if (!rc) break;

      rc = file.WriteObject(m_mapping_primitive.get());
      if (!rc) break;

      // 13 October 2006 ver 1.1 fields
      rc = file.WriteInt( static_cast<unsigned int>(m_texture_space) );
      if (!rc) break;

      rc = file.WriteBool(m_bCapped);
      if (!rc) break;

      break;
    }

    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  return rc;
}